

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_socket.c
# Opt level: O0

int mk_socket_set_tcp_defer_accept(int sockfd)

{
  int iVar1;
  undefined4 local_10;
  int local_c;
  int timeout;
  int sockfd_local;
  
  local_10 = 0;
  local_c = sockfd;
  iVar1 = setsockopt(sockfd,6,9,&local_10,4);
  return iVar1;
}

Assistant:

int mk_socket_set_tcp_defer_accept(int sockfd)
{
#if defined (__linux__)
    int timeout = 0;

    return setsockopt(sockfd, IPPROTO_TCP, TCP_DEFER_ACCEPT, &timeout, sizeof(int));
#else
    (void) sockfd;
    return -1;
#endif
}